

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop.c
# Opt level: O2

Qiniu_Error
Qiniu_FOP_Prefop(Qiniu_Client *self,Qiniu_FOP_PrefopRet *ret,Qiniu_FOP_PrefopItemRet *itemsRet,
                Qiniu_ItemCount *itemsCount,char *persistentId,Qiniu_ItemCount maxItemsCount)

{
  Qiniu_FOP_PrefopRet *pQVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *url;
  Qiniu_Json *array;
  cJSON *self_00;
  Qiniu_FnRead p_Var5;
  long lVar6;
  long lVar7;
  int *piVar8;
  Qiniu_Reader QVar9;
  Qiniu_Error QVar10;
  Qiniu_Reader body;
  cJSON *root;
  Qiniu_Bool escapePersistentIdOk;
  char *apiHost;
  Qiniu_ReadBuf emptyBodyBuf;
  Qiniu_Json *local_78;
  Qiniu_FnRead local_70;
  Qiniu_ItemCount local_68;
  int local_64;
  int *local_60;
  Qiniu_FOP_PrefopRet *local_58;
  char *local_50;
  Qiniu_ReadBuf local_48;
  
  local_48.buf = (char *)0x0;
  local_48.off = 0;
  local_48.limit = 0;
  local_60 = itemsCount;
  local_58 = ret;
  QVar9 = Qiniu_BufReader(&local_48,(char *)0x0,0);
  local_70 = QVar9.Read;
  pcVar4 = Qiniu_QueryEscape(persistentId,&local_64);
  QVar10 = _Qiniu_Region_Get_Api_Host(self,(char *)0x0,(char *)0x0,&local_50);
  uVar2 = QVar10.code;
  p_Var5 = (Qiniu_FnRead)QVar10.message;
  if (uVar2 == 200) {
    local_68 = maxItemsCount;
    url = Qiniu_String_Concat(local_50,"/status/get/prefop?id=",pcVar4,0);
    if (local_64 != 0) {
      Qiniu_Free(pcVar4);
    }
    body.Read = local_70;
    body.self = QVar9.self;
    QVar10 = Qiniu_Client_CallWithMethod
                       (self,&local_78,url,body,0,"application/x-www-form-urlencoded","GET",
                        (char *)0x0);
    local_70 = (Qiniu_FnRead)QVar10.message;
    uVar2 = QVar10.code;
    Qiniu_Free(url);
    p_Var5 = local_70;
    if (uVar2 == 200) {
      pcVar4 = Qiniu_Json_GetString(local_78,"id",(char *)0x0);
      pQVar1 = local_58;
      local_58->id = pcVar4;
      iVar3 = Qiniu_Json_GetInt(local_78,"code",0);
      pQVar1->code = iVar3;
      pcVar4 = Qiniu_Json_GetString(local_78,"desc",(char *)0x0);
      pQVar1->desc = pcVar4;
      pcVar4 = Qiniu_Json_GetString(local_78,"inputBucket",(char *)0x0);
      pQVar1->inputBucket = pcVar4;
      pcVar4 = Qiniu_Json_GetString(local_78,"inputBucket",(char *)0x0);
      pQVar1->inputKey = pcVar4;
      pcVar4 = Qiniu_Json_GetString(local_78,"taskFrom",(char *)0x0);
      pQVar1->taskFrom = pcVar4;
      iVar3 = Qiniu_Json_GetInt(local_78,"type",0);
      pQVar1->type = iVar3;
      pcVar4 = Qiniu_Json_GetString(local_78,"creationDate",(char *)0x0);
      if (pcVar4 != (char *)0x0) {
        _Qiniu_Parse_Date_Time(pcVar4,&pQVar1->creationDate);
      }
      iVar3 = Qiniu_Json_GetArraySize(local_78,"items",0);
      *local_60 = iVar3;
      array = Qiniu_Json_GetObjectItem(local_78,"items",(Qiniu_Json *)0x0);
      lVar6 = (long)local_68;
      piVar8 = &itemsRet->returnOld;
      for (lVar7 = 0; (uVar2 = 200, p_Var5 = local_70, lVar7 < lVar6 && (lVar7 < *local_60));
          lVar7 = lVar7 + 1) {
        self_00 = cJSON_GetArrayItem(array,(int)lVar7);
        pcVar4 = Qiniu_Json_GetString(self_00,"cmd",(char *)0x0);
        ((Qiniu_FOP_PrefopItemRet *)(piVar8 + -0xb))->cmd = pcVar4;
        iVar3 = Qiniu_Json_GetInt(self_00,"code",0);
        piVar8[-1] = iVar3;
        pcVar4 = Qiniu_Json_GetString(self_00,"desc",(char *)0x0);
        *(char **)(piVar8 + -9) = pcVar4;
        pcVar4 = Qiniu_Json_GetString(self_00,"error",(char *)0x0);
        *(char **)(piVar8 + -7) = pcVar4;
        pcVar4 = Qiniu_Json_GetString(self_00,"hash",(char *)0x0);
        *(char **)(piVar8 + -5) = pcVar4;
        pcVar4 = Qiniu_Json_GetString(self_00,"key",(char *)0x0);
        *(char **)(piVar8 + -3) = pcVar4;
        iVar3 = Qiniu_Json_GetInt(self_00,"returnOld",0);
        *piVar8 = iVar3;
        piVar8 = piVar8 + 0xc;
      }
    }
  }
  QVar10._4_4_ = 0;
  QVar10.code = uVar2;
  QVar10.message = (char *)p_Var5;
  return QVar10;
}

Assistant:

Qiniu_Error Qiniu_FOP_Prefop(Qiniu_Client *self, Qiniu_FOP_PrefopRet *ret, Qiniu_FOP_PrefopItemRet *itemsRet, Qiniu_ItemCount *itemsCount, const char *persistentId, Qiniu_ItemCount maxItemsCount)
{
    Qiniu_Error err;
    cJSON *root, *items, *item;
    Qiniu_ItemCount curIndex;
    char *encodedPersistentId = NULL, *url = NULL, *creationDateStr = NULL;
    Qiniu_ReadBuf emptyBodyBuf = {NULL, 0, 0};
    Qiniu_Reader emptyBody = Qiniu_BufReader(&emptyBodyBuf, 0, 0);
    Qiniu_Bool escapePersistentIdOk;

    encodedPersistentId = Qiniu_QueryEscape(persistentId, &escapePersistentIdOk);

    const char *apiHost;
    err = _Qiniu_Region_Get_Api_Host(self, NULL, NULL, &apiHost);
    if (err.code != 200)
    {
        return err;
    }
    url = Qiniu_String_Concat(apiHost, "/status/get/prefop?id=", encodedPersistentId, NULL);
    if (escapePersistentIdOk)
    {
        Qiniu_Free(encodedPersistentId);
    }

    err = Qiniu_Client_CallWithMethod(
        self,
        &root,
        url,
        emptyBody,
        0,
        "application/x-www-form-urlencoded",
        "GET",
        NULL);
    Qiniu_Free(url);
    if (err.code != 200)
    {
        return err;
    }

    ret->id = Qiniu_Json_GetString(root, "id", NULL);
    ret->code = Qiniu_Json_GetInt(root, "code", 0);
    ret->desc = Qiniu_Json_GetString(root, "desc", NULL);
    ret->inputBucket = Qiniu_Json_GetString(root, "inputBucket", NULL);
    ret->inputKey = Qiniu_Json_GetString(root, "inputBucket", NULL);
    ret->taskFrom = Qiniu_Json_GetString(root, "taskFrom", NULL);
    ret->type = Qiniu_Json_GetInt(root, "type", 0);
    creationDateStr = (char *)Qiniu_Json_GetString(root, "creationDate", NULL);
    if (creationDateStr != NULL)
    {
        _Qiniu_Parse_Date_Time(creationDateStr, &ret->creationDate);
    }

    *itemsCount = Qiniu_Json_GetArraySize(root, "items", 0);
    items = Qiniu_Json_GetObjectItem(root, "items", 0);
    for (curIndex = 0; curIndex < *itemsCount && curIndex < maxItemsCount; curIndex++)
    {
        item = cJSON_GetArrayItem(items, curIndex);
        itemsRet[curIndex].cmd = Qiniu_Json_GetString(item, "cmd", NULL);
        itemsRet[curIndex].code = Qiniu_Json_GetInt(item, "code", 0);
        itemsRet[curIndex].desc = Qiniu_Json_GetString(item, "desc", NULL);
        itemsRet[curIndex].error = Qiniu_Json_GetString(item, "error", NULL);
        itemsRet[curIndex].hash = Qiniu_Json_GetString(item, "hash", NULL);
        itemsRet[curIndex].key = Qiniu_Json_GetString(item, "key", NULL);
        itemsRet[curIndex].returnOld = Qiniu_Json_GetInt(item, "returnOld", 0);
    }
    return err;
}